

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

void __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix44<double>_>::copyValueFrom
          (TypedAttribute<Imath_2_5::Matrix44<double>_> *this,Attribute *other)

{
  TypedAttribute<Imath_2_5::Matrix44<double>_> *pTVar1;
  
  pTVar1 = cast(other);
  Imath_2_5::Matrix44<double>::operator=(&this->_value,&pTVar1->_value);
  return;
}

Assistant:

void		
TypedAttribute<T>::copyValueFrom (const Attribute &other)
{
    _value = cast(other)._value;
}